

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkMoveNames(Abc_Ntk_t *pNtk,Abc_Ntk_t *pOld)

{
  Nm_Man_t *pNVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  
  Nm_ManFree(pNtk->pManName);
  pNVar1 = Nm_ManCreate(pNtk->vCos->nSize + pNtk->vCis->nSize + pNtk->vBoxes->nSize);
  pNtk->pManName = pNVar1;
  for (iVar6 = 0; iVar6 < pNtk->vPis->nSize; iVar6 = iVar6 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,iVar6);
    pAVar3 = Abc_NtkPi(pOld,iVar6);
    pcVar4 = Abc_ObjName(pAVar3);
    Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
  }
  for (iVar6 = 0; iVar6 < pNtk->vPos->nSize; iVar6 = iVar6 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,iVar6);
    pAVar3 = Abc_NtkPo(pOld,iVar6);
    pcVar4 = Abc_ObjName(pAVar3);
    Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
  }
  for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,iVar6);
    if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
      pAVar3 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
      pAVar5 = Abc_NtkBox(pOld,iVar6);
      pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
      Abc_ObjAssignName(pAVar3,pcVar4,(char *)0x0);
      pAVar2 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray];
      pAVar3 = Abc_NtkBox(pOld,iVar6);
      pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray]);
      Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
    }
  }
  Abc_NtkRedirectCiCo(pNtk);
  return;
}

Assistant:

void Abc_NtkMoveNames( Abc_Ntk_t * pNtk, Abc_Ntk_t * pOld )
{
    Abc_Obj_t * pObj; int i;
    Nm_ManFree( pNtk->pManName );
    pNtk->pManName = Nm_ManCreate( Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk) + Abc_NtkBoxNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjName(Abc_NtkPi(pOld, i)), NULL );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjName(Abc_NtkPo(pOld, i)), NULL );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_ObjFanin0(pObj),  Abc_ObjName(Abc_ObjFanin0(Abc_NtkBox(pOld, i))),  NULL );
        Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjName(Abc_ObjFanout0(Abc_NtkBox(pOld, i))), NULL );
    }
    Abc_NtkRedirectCiCo( pNtk );
}